

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicNetwork.hpp
# Opt level: O2

void __thiscall
BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::~BasicNetwork
          (BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *this)

{
  IEventManager *pIVar1;
  _Base_ptr p_Var2;
  
  (this->super_INetwork)._vptr_INetwork = (_func_int **)&PTR__BasicNetwork_00118ca8;
  for (p_Var2 = (this->super_INetwork).neuronMap._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->super_INetwork).neuronMap._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (p_Var2[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var2[1]._M_parent + 0x18))();
    }
  }
  pIVar1 = (this->super_INetwork).eventManager;
  if (pIVar1 != (IEventManager *)0x0) {
    (**(code **)(*(long *)pIVar1 + 8))();
  }
  INetwork::~INetwork(&this->super_INetwork);
  return;
}

Assistant:

BasicNetwork<Neuron, Synapse, EventManager>::~BasicNetwork()
{
    for ( auto id_ptr: neuronMap ) {
        delete id_ptr.second;
    }
    delete eventManager;
}